

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::BlockChecked
          (PeerManagerImpl *this,CBlock *block,BlockValidationState *state)

{
  list<long,_std::allocator<long>_> *this_00;
  byte bVar1;
  ModeState MVar2;
  NodeId pnode;
  _List_node_base *pnode_00;
  _List_iterator<long> __x;
  _List_node_base *p_Var3;
  function<bool_(CNode_*)> func;
  bool bVar4;
  iterator __position;
  CNodeState *pCVar5;
  size_type sVar6;
  CNodeState *pCVar7;
  _List_iterator<long> _Var8;
  const_iterator __position_00;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff58 [12];
  int iVar9;
  _List_node_base *p_Var10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  uint256 hash;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock46,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x8f2,false);
  CBlockHeader::GetHash(&hash,&block->super_CBlockHeader);
  __position = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
               ::find(&(this->mapBlockSource)._M_t,&hash);
  MVar2 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  if (MVar2 == M_VALID) {
    bVar4 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
    if (!bVar4) {
      sVar6 = std::
              multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              ::count(&this->mapBlocksInFlight,&hash);
      if ((_Rb_tree_header *)__position._M_node !=
          &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header &&
          sVar6 == (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pnode_00 = *(_List_node_base **)(__position._M_node + 2);
        if ((this->m_opts).ignore_incoming_txs == false) {
          p_Var10 = pnode_00;
          pCVar5 = State(this,(NodeId)pnode_00);
          if ((pCVar5 != (CNodeState *)0x0) && (pCVar5->m_provides_cmpctblocks == true)) {
            this_00 = &this->lNodesAnnouncingHeaderAndIDs;
            iVar9 = 0;
            __position_00._M_node = (_List_node_base *)this_00;
            while (__position_00._M_node = (__position_00._M_node)->_M_next,
                  __position_00._M_node != (_List_node_base *)this_00) {
              if (__position_00._M_node[1]._M_next == pnode_00) {
                std::__cxx11::list<long,_std::allocator<long>_>::erase(this_00,__position_00);
                std::__cxx11::list<long,_std::allocator<long>_>::push_back
                          (this_00,(value_type_conflict6 *)&stack0xffffffffffffff70);
                goto LAB_0072bb29;
              }
              pCVar7 = State(this,(NodeId)__position_00._M_node[1]._M_next);
              if (pCVar7 != (CNodeState *)0x0) {
                iVar9 = iVar9 + (pCVar7->m_is_inbound ^ 1);
              }
            }
            if ((((code)pCVar5->m_is_inbound == (code)0x1) &&
                (2 < (this->lNodesAnnouncingHeaderAndIDs).
                     super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size)) &&
               (iVar9 == 1)) {
              __x._M_node = (this->lNodesAnnouncingHeaderAndIDs).
                            super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                            super__List_node_base._M_next;
              pCVar7 = State(this,(NodeId)__x._M_node[1]._M_next);
              if ((pCVar7 != (CNodeState *)0x0) && (pCVar7->m_is_inbound == false)) {
                _Var8 = std::next<std::_List_iterator<long>>(__x,1);
                p_Var3 = __x._M_node[1]._M_next;
                __x._M_node[1]._M_next = _Var8._M_node[1]._M_next;
                _Var8._M_node[1]._M_next = p_Var3;
              }
            }
            local_58._8_8_ = 0;
            local_40 = std::
                       _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:1422:31)>
                       ::_M_invoke;
            local_48 = std::
                       _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:1422:31)>
                       ::_M_manager;
            func.super__Function_base._M_functor._12_4_ = iVar9;
            func.super__Function_base._M_functor._0_12_ = in_stack_ffffffffffffff58;
            func.super__Function_base._M_manager = (_Manager_type)pCVar5;
            func._M_invoker = (_Invoker_type)p_Var10;
            local_58._M_unused._M_object = this;
            CConnman::ForNode(this->m_connman,(NodeId)pnode_00,func);
            std::_Function_base::~_Function_base((_Function_base *)&local_58);
          }
        }
      }
    }
  }
  else if ((MVar2 == M_INVALID) &&
          ((_Rb_tree_header *)__position._M_node !=
           &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header)) {
    pnode = *(NodeId *)(__position._M_node + 2);
    pCVar5 = State(this,pnode);
    if (pCVar5 != (CNodeState *)0x0) {
      bVar1 = *(byte *)&__position._M_node[2]._M_parent;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58._M_pod_data,"",(allocator<char> *)&stack0xffffffffffffff70);
      MaybePunishNodeForBlock(this,pnode,state,(bool)(bVar1 ^ 1),(string *)&local_58);
      std::__cxx11::string::~string((string *)local_58._M_pod_data);
    }
  }
LAB_0072bb29:
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
    ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                        *)&this->mapBlockSource,__position);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock46.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockChecked(const CBlock& block, const BlockValidationState& state)
{
    LOCK(cs_main);

    const uint256 hash(block.GetHash());
    std::map<uint256, std::pair<NodeId, bool>>::iterator it = mapBlockSource.find(hash);

    // If the block failed validation, we know where it came from and we're still connected
    // to that peer, maybe punish.
    if (state.IsInvalid() &&
        it != mapBlockSource.end() &&
        State(it->second.first)) {
            MaybePunishNodeForBlock(/*nodeid=*/ it->second.first, state, /*via_compact_block=*/ !it->second.second);
    }
    // Check that:
    // 1. The block is valid
    // 2. We're not in initial block download
    // 3. This is currently the best block we're aware of. We haven't updated
    //    the tip yet so we have no way to check this directly here. Instead we
    //    just check that there are currently no other blocks in flight.
    else if (state.IsValid() &&
             !m_chainman.IsInitialBlockDownload() &&
             mapBlocksInFlight.count(hash) == mapBlocksInFlight.size()) {
        if (it != mapBlockSource.end()) {
            MaybeSetPeerAsAnnouncingHeaderAndIDs(it->second.first);
        }
    }
    if (it != mapBlockSource.end())
        mapBlockSource.erase(it);
}